

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
AlphaVectorPlanning::GetDuplicateIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,VectorSet *V)

{
  uint uVar1;
  pointer piVar2;
  pointer pdVar3;
  undefined4 in_EAX;
  ulong uVar4;
  long lVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uStack_28;
  value_type_conflict4 local_24;
  
  uVar1 = (uint)V->size1_;
  uVar9 = (ulong)(uint)V->size2_;
  _uStack_28 = CONCAT44(0xffffffff,in_EAX);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(int)uVar1,&local_24,
             (allocator_type *)((long)&uStack_28 + 3));
  if ((ulong)uVar1 != 1) {
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 1;
    lVar5 = 8;
    auVar10._8_8_ = 0x7fffffffffffffff;
    auVar10._0_8_ = 0x7fffffffffffffff;
    do {
      pdVar3 = (V->data_).data_;
      uVar7 = 0;
      pdVar6 = pdVar3;
      do {
        if (uVar9 == 0) {
          uVar7 = 0;
LAB_003a251b:
          piVar2[uVar4] = (int)uVar7;
          break;
        }
        uVar8 = 0;
        while (auVar11._8_8_ = 0,
              auVar11._0_8_ =
                   *(double *)((long)pdVar3 + uVar8 * 8 + V->size2_ * lVar5) - pdVar6[uVar8],
              auVar11 = vandpd_avx(auVar11,auVar10), auVar11._0_8_ <= 1e-12) {
          uVar8 = uVar8 + 1;
          if (uVar9 == uVar8) goto LAB_003a251b;
        }
        uVar7 = uVar7 + 1;
        pdVar6 = pdVar6 + V->size2_;
      } while (uVar7 != uVar4);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 != uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> AlphaVectorPlanning::GetDuplicateIndices(const VectorSet &V)
{
    int nrInV=V.size1(), nrS=V.size2();
    bool equal;

    vector<int> duplicates(nrInV,-1);

    for(int i=1;i!=nrInV;++i) // start at 1, first is never a duplicate
    {
        for(int j=0;j!=i;++j) // loop over all previous vectors
        {
            equal=true;
            for(int s=0;s!=nrS;++s)
            {
                if(abs(V(i,s)-V(j,s))>PROB_PRECISION)
                {
                    equal=false;
                    break; // if 1 number differs, they are not equal
                }
            }
            if(equal)
            {
                duplicates[i]=j;
                break; // we need to find only the first duplicate
            }
        }
    }

#if 0 // reduce verbosity
    PrintVectorCout(duplicates); cout << endl;
#endif
    return(duplicates);
}